

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O2

int dobind(KEYMAP *curmap,char *p,int unbind)

{
  int iVar1;
  uint uVar2;
  PF p_Var3;
  char *pcVar4;
  char *pcVar5;
  KEYMAP *pref_map;
  code *funct;
  long lVar6;
  char local_98 [8];
  char bprompt [80];
  KEYMAP *local_38;
  KEYMAP *curmap_local;
  
  local_38 = curmap;
  if (macrodef != 0) {
    iVar1 = dobeep_msg("Can\'t rebind key in macro");
    return iVar1;
  }
  if (inmacro == 0) {
    uVar2 = strlcpy(local_98,p,0x50);
    lVar6 = 0x4f;
    if (uVar2 < 0x50) {
      lVar6 = (long)(int)uVar2;
    }
    pcVar5 = local_98 + lVar6;
    while( true ) {
      ewprintf("%s",local_98);
      pcVar5[-1] = ' ';
      iVar1 = getkey(0);
      pcVar4 = getkeyname(pcVar5,(size_t)(bprompt + (0x48 - (long)pcVar5)),iVar1);
      p_Var3 = doscan(local_38,iVar1,&local_38);
      if (p_Var3 != (PF)0x0) break;
      pcVar5 = pcVar4 + 1;
      pcVar4[0] = '-';
      pcVar4[1] = '\0';
    }
  }
  else {
    for (lVar6 = 0; lVar6 < (long)maclcur->l_used + -1; lVar6 = lVar6 + 1) {
      uVar2 = (uint)(byte)maclcur->l_text[lVar6];
      p_Var3 = doscan(local_38,uVar2,&local_38);
      if ((p_Var3 != (PF)0x0) && (iVar1 = remap(local_38,uVar2,(PF)0x0,(KEYMAP *)0x0), iVar1 != 1))
      {
        return 0;
      }
    }
    iVar1 = (int)maclcur->l_text[lVar6];
    doscan(local_38,iVar1,(KEYMAP **)0x0);
    maclcur = maclcur->l_fp;
  }
  if (unbind == 0) {
    pcVar5 = eread("%s to command: ",local_98,0x50,9,local_98);
    if (pcVar5 == (char *)0x0) {
      return 2;
    }
    if (*pcVar5 == '\0') {
      return 0;
    }
    funct = name_function(local_98);
    if (funct == (PF)0x0) {
      pref_map = name_map(local_98);
      if (pref_map == (KEYMAP *)0x0) {
        iVar1 = dobeep_msg("[No match]");
        return iVar1;
      }
      funct = (PF)0x0;
      goto LAB_0010d44d;
    }
  }
  else {
    funct = rescan;
  }
  pref_map = (KEYMAP *)0x0;
LAB_0010d44d:
  iVar1 = remap(local_38,iVar1,funct,pref_map);
  return iVar1;
}

Assistant:

static int
dobind(KEYMAP *curmap, const char *p, int unbind)
{
	KEYMAP	*pref_map = NULL;
	PF	 funct;
	char	 bprompt[80], *bufp, *pep;
	int	 c, s, n;

	if (macrodef) {
		/*
		 * Keystrokes aren't collected. Not hard, but pretty useless.
		 * Would not work for function keys in any case.
		 */
		return (dobeep_msg("Can't rebind key in macro"));
	}
	if (inmacro) {
		for (s = 0; s < maclcur->l_used - 1; s++) {
			if (doscan(curmap, c = CHARMASK(maclcur->l_text[s]), &curmap)
			    != NULL) {
				if (remap(curmap, c, NULL, NULL)
				    != TRUE)
					return (FALSE);
			}
		}
		(void)doscan(curmap, c = maclcur->l_text[s], NULL);
		maclcur = maclcur->l_fp;
	} else {
		n = strlcpy(bprompt, p, sizeof(bprompt));
		if (n >= sizeof(bprompt))
			n = sizeof(bprompt) - 1;
		pep = bprompt + n;
		for (;;) {
			ewprintf("%s", bprompt);
			pep[-1] = ' ';
			pep = getkeyname(pep, sizeof(bprompt) -
			    (pep - bprompt), c = getkey(FALSE));
			if (doscan(curmap, c, &curmap) != NULL)
				break;
			*pep++ = '-';
			*pep = '\0';
		}
	}
	if (unbind)
		funct = rescan;
	else {
		if ((bufp = eread("%s to command: ", bprompt, sizeof(bprompt),
		    EFFUNC | EFNEW, bprompt)) == NULL)
			return (ABORT);
		else if (bufp[0] == '\0')
			return (FALSE);
		if (((funct = name_function(bprompt)) == NULL) ?
		    (pref_map = name_map(bprompt)) == NULL : funct == NULL)
			return (dobeep_msg("[No match]"));

	}
	return (remap(curmap, c, funct, pref_map));
}